

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Data
          (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this,
          Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *other,size_t reserved)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  QSocketNotifier *pQVar6;
  QSocketNotifier *pQVar7;
  QSocketNotifier *pQVar8;
  ulong uVar9;
  Node<int,_QSocketNotifierSetUNIX> *pNVar10;
  long lVar11;
  ulong uVar12;
  size_t numBuckets;
  long lVar13;
  R_conflict7 RVar14;
  Bucket BVar15;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar3 = other->size;
  this->size = uVar3;
  if (reserved < uVar3) {
    reserved = uVar3;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar11 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar11 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar14 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar14.spans;
  uVar3 = other->numBuckets;
  if (0x7f < uVar3) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      pSVar4 = other->spans;
      lVar13 = 0;
      do {
        bVar2 = pSVar4->offsets[lVar13 + lVar11];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar12].entries;
          uVar9 = (long)*(int *)pEVar5[bVar2].storage.data ^ this->seed;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          BVar15 = findBucketWithHash<int>(this,(int *)(pEVar5 + bVar2),uVar9 >> 0x20 ^ uVar9);
          pNVar10 = Span<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::insert
                              (BVar15.span,BVar15.index);
          pQVar6 = *(QSocketNotifier **)(pEVar5[bVar2].storage.data + 8);
          puVar1 = pEVar5[bVar2].storage.data + 0x10;
          pQVar7 = *(QSocketNotifier **)puVar1;
          pQVar8 = *(QSocketNotifier **)(puVar1 + 8);
          *(undefined8 *)pNVar10 = *(undefined8 *)pEVar5[bVar2].storage.data;
          (pNVar10->value).notifiers[0] = pQVar6;
          (pNVar10->value).notifiers[1] = pQVar7;
          (pNVar10->value).notifiers[2] = pQVar8;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x80);
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x90;
    } while (uVar12 != uVar3 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }